

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_set_poolsize(size_t size)

{
  bget_release_t in_RDI;
  bget_acquire_t unaff_retaddr;
  bget_compact_t in_stack_00000008;
  kmp_info_t **pool_incr;
  
  pool_incr = __kmp_threads;
  __kmp_get_global_thread_id();
  bectl((kmp_info_t *)size,in_stack_00000008,unaff_retaddr,in_RDI,(bufsize)pool_incr);
  return;
}

Assistant:

void kmpc_set_poolsize(size_t size) {
  bectl(__kmp_get_thread(), (bget_compact_t)0, (bget_acquire_t)malloc,
        (bget_release_t)free, (bufsize)size);
}